

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::HostAddress::ParseAddress(HostAddress *this)

{
  uint8_t j;
  bool bVar1;
  uint uVar2;
  long lVar3;
  reference pvVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  char cVar9;
  allocator local_cd;
  undefined4 local_cc;
  uint8_t maybeIp6 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  string tmp;
  uint local_70 [8];
  string s;
  
  std::__cxx11::string::string((string *)&s,(string *)&this->m_ipString);
  lVar3 = std::__cxx11::string::find((char)&s,0x3a);
  if (lVar3 == -1) {
LAB_0015b97f:
    lVar3 = std::__cxx11::string::find((char)&s,0x2e);
    if (lVar3 != -1) {
      tmp._M_dataplus._M_p._0_4_ = 0;
      bVar1 = ParseIp4(&s,(uint32_t *)&tmp);
      if (bVar1) {
        this->m_ip4Address = (uint32_t)tmp._M_dataplus._M_p;
        this->m_hasIpAddress = true;
        this->m_protocol = IPv4Protocol;
        goto LAB_0015b9be;
      }
    }
    this->m_protocol = UnknownNetworkProtocol;
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&tmp,(string *)&s);
    lVar3 = std::__cxx11::string::rfind((char)&tmp,0x25);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)&tmp);
      std::__cxx11::string::operator=((string *)&tmp,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
    }
    Split(&fields,&tmp,':');
    uVar2 = (uint)((int)fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (int)fields.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xff;
    if (uVar2 - 9 < 0xfffffffa) {
LAB_0015b96b:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&fields);
      std::__cxx11::string::~string((string *)&tmp);
      goto LAB_0015b97f;
    }
    std::__cxx11::string::string((string *)local_70,"::",&local_cd);
    bVar6 = 0;
    while( true ) {
      lVar3 = std::__cxx11::string::find((string *)&tmp,(ulong)local_70);
      if (lVar3 == -1) break;
      bVar6 = bVar6 + 1;
    }
    std::__cxx11::string::~string((string *)local_70);
    if (uVar2 == 8 && 1 < bVar6) goto LAB_0015b96b;
    lVar3 = std::__cxx11::string::find((char)&tmp,0x2e);
    if ((bVar6 != 1) && (uVar2 < (lVar3 == -1) + 7)) goto LAB_0015b96b;
    uVar7 = (ulong)(9 - uVar2);
    local_cc = uVar2 - 1;
    lVar3 = 0x10;
    uVar8 = local_cc;
    while ((cVar9 = (char)uVar8, -1 < cVar9 && (lVar3 != 0))) {
      uVar8 = (uint)cVar9;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&fields,(long)(int)uVar8);
      if (pvVar4->_M_string_length == 0) {
        if (local_cc == uVar8) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&fields,(ulong)(uVar2 - 2));
        }
        else {
          if (cVar9 != '\0') {
            for (bVar6 = 0; bVar6 < uVar7; bVar6 = bVar6 + 1) {
              if (lVar3 == 0) goto LAB_0015b96b;
              (maybeIp6 + lVar3 + -2)[0] = '\0';
              (maybeIp6 + lVar3 + -2)[1] = '\0';
              lVar3 = lVar3 + -2;
            }
            goto LAB_0015bb15;
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&fields,1);
        }
        if (pvVar4->_M_string_length == 0) goto LAB_0015b96b;
        (maybeIp6 + lVar3 + -2)[0] = '\0';
        (maybeIp6 + lVar3 + -2)[1] = '\0';
LAB_0015bb11:
        lVar3 = lVar3 + -2;
      }
      else {
        uVar5 = strtoul((pvVar4->_M_dataplus)._M_p,(char **)0x0,0x10);
        if ((short)(uVar5 >> 0x10) == 0) {
          *(ushort *)(maybeIp6 + lVar3 + -2) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          goto LAB_0015bb11;
        }
        if (local_cc != uVar8) goto LAB_0015b96b;
        bVar1 = ParseIp4(pvVar4,local_70);
        if (!bVar1) goto LAB_0015b96b;
        *(uint *)(maybeIp6 + lVar3 + -4) =
             local_70[0] >> 0x18 | (local_70[0] & 0xff0000) >> 8 | (local_70[0] & 0xff00) << 8 |
             local_70[0] << 0x18;
        lVar3 = lVar3 + -4;
        uVar7 = uVar7 - 1;
      }
LAB_0015bb15:
      uVar8 = (uint)(byte)(cVar9 - 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
    std::__cxx11::string::~string((string *)&tmp);
    if (-1 < cVar9) goto LAB_0015b97f;
    SetAddress(this,maybeIp6);
    this->m_protocol = IPv6Protocol;
LAB_0015b9be:
    bVar1 = true;
  }
  std::__cxx11::string::~string((string *)&s);
  return bVar1;
}

Assistant:

bool HostAddress::ParseAddress()
{

    // all IPv6 addresses should have a ':'
    std::string s = m_ipString;
    std::size_t found = s.find(':');
    if (found != std::string::npos) {
        // try parse IP6 address
        uint8_t maybeIp6[16];
        if (ParseIp6(s, maybeIp6)) {
            SetAddress(maybeIp6);
            m_protocol = HostAddress::IPv6Protocol;
            return true;
        }
    }

    // all IPv4 addresses should have a '.'
    found = s.find('.');
    if (found != std::string::npos) {
        uint32_t maybeIp4(0);
        if (ParseIp4(s, maybeIp4)) {
            SetAddress(maybeIp4);
            m_protocol = HostAddress::IPv4Protocol;
            return true;
        }
    }

    // else likely just a plain-text host name "www.foo.bar"
    // will need to look up IP address info later
    m_protocol = HostAddress::UnknownNetworkProtocol;
    return false;
}